

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O2

bool __thiscall
AmpIO::GetWriteData(AmpIO *this,quadlet_t *buf,uint offset,uint numQuads,bool doSwap)

{
  uint uVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar2 = (*(this->super_FpgaIO).super_BoardIO._vptr_BoardIO[3])();
  if (uVar2 >> 2 < numQuads + offset) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"AmpIO:GetWriteData: invalid args: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,", ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  else {
    for (uVar4 = 0; numQuads != uVar4; uVar4 = uVar4 + 1) {
      uVar1 = this->WriteBuffer[offset + uVar4];
      uVar5 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      if (!doSwap) {
        uVar5 = uVar1;
      }
      buf[uVar4] = uVar5;
    }
  }
  return numQuads + offset <= uVar2 >> 2;
}

Assistant:

bool AmpIO::GetWriteData(quadlet_t *buf, unsigned int offset, unsigned int numQuads, bool doSwap) const
{
    unsigned int WriteBufSize = GetWriteNumBytes() / sizeof(quadlet_t);
    if ((offset+numQuads) > WriteBufSize) {
        std::cerr << "AmpIO:GetWriteData: invalid args: " << offset << ", " << numQuads << std::endl;
        return false;
    }

    for (size_t i = 0; i < numQuads; i++)
        buf[i] = doSwap ? bswap_32(WriteBuffer[offset+i]) : WriteBuffer[offset+i];
    return true;
}